

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

bool crn_decompress_dds_to_images
               (void *pDDS_file_data,crn_uint32 dds_file_size,crn_uint32 **ppImages,
               crn_texture_desc *tex_desc)

{
  bool bVar1;
  uint uVar2;
  pixel_format pVar3;
  mip_level *this;
  image_u8 *this_00;
  pixel_buf_t *this_01;
  crn_uint32 *pcVar4;
  image_u8 *pImg;
  mip_level *pLevel;
  uint32 l;
  uint32 f;
  undefined1 local_c8 [3];
  bool uncook;
  data_stream_serializer in_serializer;
  undefined1 local_a8 [8];
  buffer_stream in_stream;
  mipmapped_texture tex;
  crn_texture_desc *tex_desc_local;
  crn_uint32 **ppImages_local;
  crn_uint32 dds_file_size_local;
  void *pDDS_file_data_local;
  
  tex_desc->m_faces = 0;
  tex_desc->m_width = 0;
  tex_desc->m_height = 0;
  tex_desc->m_levels = 0;
  tex_desc->m_fmt_fourcc = 0;
  crnlib::mipmapped_texture::mipmapped_texture((mipmapped_texture *)&in_stream.m_size);
  crnlib::buffer_stream::buffer_stream((buffer_stream *)local_a8,pDDS_file_data,dds_file_size);
  crnlib::data_stream_serializer::data_stream_serializer
            ((data_stream_serializer *)local_c8,(data_stream *)local_a8);
  bVar1 = crnlib::mipmapped_texture::read_dds
                    ((mipmapped_texture *)&in_stream.m_size,(data_stream_serializer *)local_c8);
  if (bVar1) {
    bVar1 = crnlib::mipmapped_texture::is_packed((mipmapped_texture *)&in_stream.m_size);
    if ((!bVar1) ||
       (bVar1 = crnlib::mipmapped_texture::unpack_from_dxt
                          ((mipmapped_texture *)&in_stream.m_size,true), bVar1)) {
      uVar2 = crnlib::mipmapped_texture::get_num_faces((mipmapped_texture *)&in_stream.m_size);
      tex_desc->m_faces = uVar2;
      uVar2 = crnlib::mipmapped_texture::get_width((mipmapped_texture *)&in_stream.m_size);
      tex_desc->m_width = uVar2;
      uVar2 = crnlib::mipmapped_texture::get_height((mipmapped_texture *)&in_stream.m_size);
      tex_desc->m_height = uVar2;
      uVar2 = crnlib::mipmapped_texture::get_num_levels((mipmapped_texture *)&in_stream.m_size);
      tex_desc->m_levels = uVar2;
      pVar3 = crnlib::mipmapped_texture::get_format((mipmapped_texture *)&in_stream.m_size);
      tex_desc->m_fmt_fourcc = pVar3;
      for (pLevel._4_4_ = 0;
          uVar2 = crnlib::mipmapped_texture::get_num_faces((mipmapped_texture *)&in_stream.m_size),
          pLevel._4_4_ < uVar2; pLevel._4_4_ = pLevel._4_4_ + 1) {
        for (pLevel._0_4_ = 0;
            uVar2 = crnlib::mipmapped_texture::get_num_levels
                              ((mipmapped_texture *)&in_stream.m_size), (uint)pLevel < uVar2;
            pLevel._0_4_ = (uint)pLevel + 1) {
          this = crnlib::mipmapped_texture::get_level
                           ((mipmapped_texture *)&in_stream.m_size,pLevel._4_4_,(uint)pLevel);
          this_00 = crnlib::mip_level::get_image(this);
          this_01 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::get_pixel_buf(this_00);
          pcVar4 = (crn_uint32 *)
                   crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::assume_ownership
                             (this_01);
          uVar2 = crnlib::mipmapped_texture::get_num_levels((mipmapped_texture *)&in_stream.m_size);
          ppImages[(uint)pLevel + uVar2 * pLevel._4_4_] = pcVar4;
        }
      }
      pDDS_file_data_local._7_1_ = true;
    }
    else {
      pDDS_file_data_local._7_1_ = false;
    }
  }
  else {
    pDDS_file_data_local._7_1_ = false;
  }
  crnlib::buffer_stream::~buffer_stream((buffer_stream *)local_a8);
  crnlib::mipmapped_texture::~mipmapped_texture((mipmapped_texture *)&in_stream.m_size);
  return pDDS_file_data_local._7_1_;
}

Assistant:

bool crn_decompress_dds_to_images(const void* pDDS_file_data, crn_uint32 dds_file_size, crn_uint32** ppImages, crn_texture_desc& tex_desc)
{
    memset(&tex_desc, 0, sizeof(tex_desc));

    mipmapped_texture tex;
    buffer_stream in_stream(pDDS_file_data, dds_file_size);
    data_stream_serializer in_serializer(in_stream);
    if (!tex.read_dds(in_serializer))
    {
        return false;
    }

    if (tex.is_packed())
    {
        // TODO: Allow the user to disable uncooking of swizzled DXT5 formats?
        bool uncook = true;

        if (!tex.unpack_from_dxt(uncook))
        {
            return false;
        }
    }

    tex_desc.m_faces = tex.get_num_faces();
    tex_desc.m_width = tex.get_width();
    tex_desc.m_height = tex.get_height();
    tex_desc.m_levels = tex.get_num_levels();
    tex_desc.m_fmt_fourcc = (crn_uint32)tex.get_format();

    for (uint32 f = 0; f < tex.get_num_faces(); f++)
    {
        for (uint32 l = 0; l < tex.get_num_levels(); l++)
        {
            mip_level* pLevel = tex.get_level(f, l);
            image_u8* pImg = pLevel->get_image();
            ppImages[l + tex.get_num_levels() * f] = static_cast<crn_uint32*>(pImg->get_pixel_buf().assume_ownership());
        }
    }

    return true;
}